

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

CURLUcode curl_url_set(CURLU *u,CURLUPart what,char *part,uint flags)

{
  byte bVar1;
  uchar in;
  _Bool _Var2;
  char cVar3;
  uint uVar4;
  CURLcode CVar5;
  CURLUcode CVar6;
  uint uVar7;
  Curl_handler *pCVar8;
  size_t sVar9;
  uint *puVar10;
  long lVar11;
  char *__s;
  size_t sVar12;
  size_t sVar13;
  char *pcVar14;
  uint uVar15;
  uint uVar16;
  byte bVar17;
  bool bVar18;
  char *oldurl;
  CURLU *local_70;
  long local_60;
  dynbuf local_50;
  
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  if (part == (char *)0x0) {
    switch(what) {
    case CURLUPART_URL:
      free_urlhandle(u);
      u->query = (char *)0x0;
      u->fragment = (char *)0x0;
      u->port = (char *)0x0;
      u->path = (char *)0x0;
      u->host = (char *)0x0;
      u->zoneid = (char *)0x0;
      u->password = (char *)0x0;
      u->options = (char *)0x0;
      u->scheme = (char *)0x0;
      u->user = (char *)0x0;
      u->portnum = 0;
      return CURLUE_OK;
    case CURLUPART_SCHEME:
      break;
    case CURLUPART_USER:
      u = (CURLU *)&u->user;
      break;
    case CURLUPART_PASSWORD:
      u = (CURLU *)&u->password;
      break;
    case CURLUPART_OPTIONS:
      u = (CURLU *)&u->options;
      break;
    case CURLUPART_HOST:
      u = (CURLU *)&u->host;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      u = (CURLU *)&u->port;
      break;
    case CURLUPART_PATH:
      u = (CURLU *)&u->path;
      break;
    case CURLUPART_QUERY:
      u = (CURLU *)&u->query;
      break;
    case CURLUPART_FRAGMENT:
      u = (CURLU *)&u->fragment;
      break;
    case CURLUPART_ZONEID:
      u = (CURLU *)&u->zoneid;
      break;
    default:
      goto LAB_005af6e2;
    }
    if (u->scheme != (char *)0x0) {
      (*Curl_cfree)(u->scheme);
      u->scheme = (char *)0x0;
      return CURLUE_OK;
    }
    return CURLUE_OK;
  }
  if (CURLUPART_ZONEID < what) {
LAB_005af6e2:
    return CURLUE_UNKNOWN_PART;
  }
  bVar17 = (byte)flags >> 7;
  switch(what) {
  case CURLUPART_URL:
    sVar13 = Curl_is_absolute_url(part,(char *)0x0,(size_t)part,(flags & 0x204) != 0);
    if ((sVar13 == 0) &&
       (CVar6 = curl_url_get(u,CURLUPART_URL,&local_50.bufr,flags), CVar6 == CURLUE_OK)) {
      pcVar14 = concat_url(local_50.bufr,part);
      (*Curl_cfree)(local_50.bufr);
      if (pcVar14 == (char *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      CVar6 = parseurl_and_replace(pcVar14,u,flags);
      (*Curl_cfree)(pcVar14);
      return CVar6;
    }
    CVar6 = parseurl_and_replace(part,u,flags);
    return CVar6;
  case CURLUPART_SCHEME:
    sVar12 = strlen(part);
    if (0x28 < sVar12) {
      return CURLUE_BAD_SCHEME;
    }
    bVar18 = true;
    if (((flags & 8) == 0) &&
       (pCVar8 = Curl_builtin_scheme(part,0xffffffffffffffff), pCVar8 == (Curl_handler *)0x0)) {
      return CURLUE_UNSUPPORTED_SCHEME;
    }
    uVar7 = 0;
    bVar1 = 0;
    bVar17 = 0;
    local_60 = 0;
    local_70 = u;
    goto LAB_005af3ad;
  case CURLUPART_USER:
    local_70 = (CURLU *)&u->user;
    break;
  case CURLUPART_PASSWORD:
    local_70 = (CURLU *)&u->password;
    break;
  case CURLUPART_OPTIONS:
    local_70 = (CURLU *)&u->options;
    break;
  case CURLUPART_HOST:
    sVar12 = strcspn(part," \r\n");
    sVar9 = strlen(part);
    if (sVar9 != sVar12) {
      return CURLUE_BAD_HOSTNAME;
    }
    local_70 = (CURLU *)&u->host;
    (*Curl_cfree)(u->zoneid);
    u->zoneid = (char *)0x0;
    break;
  case CURLUPART_PORT:
    local_60 = strtol(part,&local_50.bufr,10);
    if (local_60 - 0x10000U < 0xffffffffffff0001) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    if (*local_50.bufr != '\0') {
      return CURLUE_BAD_PORT_NUMBER;
    }
    local_70 = (CURLU *)&u->port;
    uVar7 = 0;
    bVar18 = true;
    bVar1 = 0;
    bVar17 = 0;
    goto LAB_005af3ad;
  case CURLUPART_PATH:
    local_70 = (CURLU *)&u->path;
    bVar1 = 1;
    uVar7 = 0;
    bVar18 = true;
    goto LAB_005af3a4;
  case CURLUPART_QUERY:
    bVar18 = -1 < (char)(byte)flags;
    uVar7 = flags >> 8;
    local_70 = (CURLU *)&u->query;
    goto LAB_005af39b;
  case CURLUPART_FRAGMENT:
    local_70 = (CURLU *)&u->fragment;
    break;
  case CURLUPART_ZONEID:
    local_70 = (CURLU *)&u->zoneid;
  }
  bVar18 = true;
  uVar7 = 0;
LAB_005af39b:
  bVar1 = 0;
LAB_005af3a4:
  local_60 = 0;
LAB_005af3ad:
  puVar10 = (uint *)strlen(part);
  if (&UINT_007a1200 < puVar10) {
    return CURLUE_MALFORMED_INPUT;
  }
  if (bVar17 == 0) {
    __s = (*Curl_cstrdup)(part);
    pcVar14 = __s;
    if (__s != (char *)0x0) {
      do {
        lVar11 = 1;
        if (*pcVar14 == '%') {
          bVar17 = pcVar14[1];
          if (((((byte)(bVar17 - 0x30) < 10) ||
               ((bVar17 - 0x41 < 0x26 &&
                ((0x3f0000003fU >> ((ulong)(bVar17 - 0x41) & 0x3f) & 1) != 0)))) &&
              ((bVar1 = pcVar14[2], (byte)(bVar1 - 0x30) < 10 ||
               ((bVar1 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) != 0)
                ))))) && ((byte)(bVar17 + 0xbf) < 0x1a || (byte)(bVar1 + 0xbf) < 0x1a)) {
            cVar3 = Curl_raw_tolower(bVar17);
            pcVar14[1] = cVar3;
            cVar3 = Curl_raw_tolower(pcVar14[2]);
            pcVar14[2] = cVar3;
            lVar11 = 3;
          }
        }
        else if (*pcVar14 == '\0') goto LAB_005af557;
        pcVar14 = pcVar14 + lVar11;
      } while( true );
    }
  }
  else {
    Curl_dyn_init(&local_50,(long)puVar10 * 3 + 1);
    in = *part;
    if (in != '\0') {
      uVar15 = uVar7;
      do {
        if (in == ' ' && !bVar18) {
          pcVar14 = "+";
LAB_005af457:
          CVar5 = Curl_dyn_addn(&local_50,pcVar14,1);
        }
        else {
          _Var2 = Curl_isunreserved(in);
          cVar3 = *part;
          if (((bool)(cVar3 == '/' & bVar1) || _Var2) || ((cVar3 == '=' && ((uVar15 & 1) != 0)))) {
            uVar4 = uVar15 & 0xff;
            uVar16 = uVar4;
            if ((uVar15 & 1) != 0) {
              uVar16 = 0;
            }
            pcVar14 = part;
            uVar15 = uVar16;
            if (cVar3 != '=') {
              uVar15 = uVar4;
            }
            goto LAB_005af457;
          }
          CVar5 = Curl_dyn_addf(&local_50,"%%%02x");
        }
        if (CVar5 != CURLE_OK) {
          return CURLUE_OUT_OF_MEMORY;
        }
        in = part[1];
        part = part + 1;
      } while (in != '\0');
    }
    __s = Curl_dyn_ptr(&local_50);
LAB_005af557:
    if ((((uVar7 & 1) == 0) || (pcVar14 = u->query, pcVar14 == (char *)0x0)) ||
       (sVar12 = strlen(pcVar14), sVar12 == 0)) {
      if (what == CURLUPART_HOST) {
        sVar13 = strlen(__s);
        if (sVar13 == 0) {
          if ((flags >> 10 & 1) != 0) goto LAB_005af63b;
          sVar13 = 0;
        }
        CVar6 = hostname_check(u,__s,sVar13);
        if (CVar6 != CURLUE_OK) {
          (*Curl_cfree)(__s);
          return CURLUE_BAD_HOSTNAME;
        }
      }
LAB_005af63b:
      (*Curl_cfree)(local_70->scheme);
      local_70->scheme = __s;
      if (local_60 != 0) {
        u->portnum = local_60;
        return CURLUE_OK;
      }
      return CURLUE_OK;
    }
    cVar3 = pcVar14[sVar12 - 1];
    Curl_dyn_init(&local_50,8000000);
    CVar5 = Curl_dyn_addn(&local_50,u->query,sVar12);
    if (((CVar5 == CURLE_OK) &&
        ((cVar3 == '&' || (CVar5 = Curl_dyn_addn(&local_50,"&",1), CVar5 == CURLE_OK)))) &&
       (CVar5 = Curl_dyn_add(&local_50,__s), CVar5 == CURLE_OK)) {
      (*Curl_cfree)(__s);
      (*Curl_cfree)(local_70->scheme);
      pcVar14 = Curl_dyn_ptr(&local_50);
      local_70->scheme = pcVar14;
      return CURLUE_OK;
    }
    (*Curl_cfree)(__s);
  }
  return CURLUE_OUT_OF_MEMORY;
}

Assistant:

CURLUcode curl_url_set(CURLU *u, CURLUPart what,
                       const char *part, unsigned int flags)
{
  char **storep = NULL;
  long port = 0;
  bool urlencode = (flags & CURLU_URLENCODE)? 1 : 0;
  bool plusencode = FALSE;
  bool urlskipslash = FALSE;
  bool appendquery = FALSE;
  bool equalsencode = FALSE;

  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part) {
    /* setting a part to NULL clears it */
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      storep = &u->scheme;
      break;
    case CURLUPART_USER:
      storep = &u->user;
      break;
    case CURLUPART_PASSWORD:
      storep = &u->password;
      break;
    case CURLUPART_OPTIONS:
      storep = &u->options;
      break;
    case CURLUPART_HOST:
      storep = &u->host;
      break;
    case CURLUPART_ZONEID:
      storep = &u->zoneid;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      storep = &u->port;
      break;
    case CURLUPART_PATH:
      storep = &u->path;
      break;
    case CURLUPART_QUERY:
      storep = &u->query;
      break;
    case CURLUPART_FRAGMENT:
      storep = &u->fragment;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if(storep && *storep) {
      Curl_safefree(*storep);
    }
    else if(!storep) {
      free_urlhandle(u);
      memset(u, 0, sizeof(struct Curl_URL));
    }
    return CURLUE_OK;
  }

  switch(what) {
  case CURLUPART_SCHEME:
    if(strlen(part) > MAX_SCHEME_LEN)
      /* too long */
      return CURLUE_BAD_SCHEME;
    if(!(flags & CURLU_NON_SUPPORT_SCHEME) &&
       /* verify that it is a fine scheme */
       !Curl_builtin_scheme(part, CURL_ZERO_TERMINATED))
      return CURLUE_UNSUPPORTED_SCHEME;
    storep = &u->scheme;
    urlencode = FALSE; /* never */
    break;
  case CURLUPART_USER:
    storep = &u->user;
    break;
  case CURLUPART_PASSWORD:
    storep = &u->password;
    break;
  case CURLUPART_OPTIONS:
    storep = &u->options;
    break;
  case CURLUPART_HOST: {
    size_t len = strcspn(part, " \r\n");
    if(strlen(part) != len)
      /* hostname with bad content */
      return CURLUE_BAD_HOSTNAME;
    storep = &u->host;
    Curl_safefree(u->zoneid);
    break;
  }
  case CURLUPART_ZONEID:
    storep = &u->zoneid;
    break;
  case CURLUPART_PORT:
  {
    char *endp;
    urlencode = FALSE; /* never */
    port = strtol(part, &endp, 10);  /* Port number must be decimal */
    if((port <= 0) || (port > 0xffff))
      return CURLUE_BAD_PORT_NUMBER;
    if(*endp)
      /* weirdly provided number, not good! */
      return CURLUE_BAD_PORT_NUMBER;
    storep = &u->port;
  }
  break;
  case CURLUPART_PATH:
    urlskipslash = TRUE;
    storep = &u->path;
    break;
  case CURLUPART_QUERY:
    plusencode = urlencode;
    appendquery = (flags & CURLU_APPENDQUERY)?1:0;
    equalsencode = appendquery;
    storep = &u->query;
    break;
  case CURLUPART_FRAGMENT:
    storep = &u->fragment;
    break;
  case CURLUPART_URL: {
    /*
     * Allow a new URL to replace the existing (if any) contents.
     *
     * If the existing contents is enough for a URL, allow a relative URL to
     * replace it.
     */
    CURLUcode result;
    char *oldurl;
    char *redired_url;

    /* if the new thing is absolute or the old one is not
     * (we could not get an absolute url in 'oldurl'),
     * then replace the existing with the new. */
    if(Curl_is_absolute_url(part, NULL, 0,
                            flags & (CURLU_GUESS_SCHEME|
                                     CURLU_DEFAULT_SCHEME))
       || curl_url_get(u, CURLUPART_URL, &oldurl, flags)) {
      return parseurl_and_replace(part, u, flags);
    }

    /* apply the relative part to create a new URL
     * and replace the existing one with it. */
    redired_url = concat_url(oldurl, part);
    free(oldurl);
    if(!redired_url)
      return CURLUE_OUT_OF_MEMORY;

    result = parseurl_and_replace(redired_url, u, flags);
    free(redired_url);
    return result;
  }
  default:
    return CURLUE_UNKNOWN_PART;
  }
  DEBUGASSERT(storep);
  {
    const char *newp = part;
    size_t nalloc = strlen(part);

    if(nalloc > CURL_MAX_INPUT_LENGTH)
      /* excessive input length */
      return CURLUE_MALFORMED_INPUT;

    if(urlencode) {
      const unsigned char *i;
      struct dynbuf enc;

      Curl_dyn_init(&enc, nalloc * 3 + 1);

      for(i = (const unsigned char *)part; *i; i++) {
        CURLcode result;
        if((*i == ' ') && plusencode) {
          result = Curl_dyn_addn(&enc, "+", 1);
          if(result)
            return CURLUE_OUT_OF_MEMORY;
        }
        else if(Curl_isunreserved(*i) ||
                ((*i == '/') && urlskipslash) ||
                ((*i == '=') && equalsencode)) {
          if((*i == '=') && equalsencode)
            /* only skip the first equals sign */
            equalsencode = FALSE;
          result = Curl_dyn_addn(&enc, i, 1);
          if(result)
            return CURLUE_OUT_OF_MEMORY;
        }
        else {
          result = Curl_dyn_addf(&enc, "%%%02x", *i);
          if(result)
            return CURLUE_OUT_OF_MEMORY;
        }
      }
      newp = Curl_dyn_ptr(&enc);
    }
    else {
      char *p;
      newp = strdup(part);
      if(!newp)
        return CURLUE_OUT_OF_MEMORY;
      p = (char *)newp;
      while(*p) {
        /* make sure percent encoded are lower case */
        if((*p == '%') && ISXDIGIT(p[1]) && ISXDIGIT(p[2]) &&
           (ISUPPER(p[1]) || ISUPPER(p[2]))) {
          p[1] = Curl_raw_tolower(p[1]);
          p[2] = Curl_raw_tolower(p[2]);
          p += 3;
        }
        else
          p++;
      }
    }

    if(appendquery) {
      /* Append the 'newp' string onto the old query. Add a '&' separator if
         none is present at the end of the existing query already */

      size_t querylen = u->query ? strlen(u->query) : 0;
      bool addamperand = querylen && (u->query[querylen -1] != '&');
      if(querylen) {
        struct dynbuf enc;
        Curl_dyn_init(&enc, CURL_MAX_INPUT_LENGTH);

        if(Curl_dyn_addn(&enc, u->query, querylen)) /* add original query */
          goto nomem;

        if(addamperand) {
          if(Curl_dyn_addn(&enc, "&", 1))
            goto nomem;
        }
        if(Curl_dyn_add(&enc, newp))
          goto nomem;
        free((char *)newp);
        free(*storep);
        *storep = Curl_dyn_ptr(&enc);
        return CURLUE_OK;
        nomem:
        free((char *)newp);
        return CURLUE_OUT_OF_MEMORY;
      }
    }

    if(what == CURLUPART_HOST) {
      size_t n = strlen(newp);
      if(!n && (flags & CURLU_NO_AUTHORITY)) {
        /* Skip hostname check, it's allowed to be empty. */
      }
      else {
        if(hostname_check(u, (char *)newp, n)) {
          free((char *)newp);
          return CURLUE_BAD_HOSTNAME;
        }
      }
    }

    free(*storep);
    *storep = (char *)newp;
  }
  /* set after the string, to make it not assigned if the allocation above
     fails */
  if(port)
    u->portnum = port;
  return CURLUE_OK;
}